

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeDamped::initialize(FluctuatingChargeDamped *this)

{
  double dVar1;
  Globals *pGVar2;
  FluctuatingChargeParameters *pFVar3;
  
  FluctuatingChargePropagator::initialize(&this->super_FluctuatingChargePropagator);
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    pGVar2 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    if ((pGVar2->Dt).super_ParameterBase.empty_ == false) {
      dVar1 = (pGVar2->Dt).data_;
      this->dt_ = dVar1;
      this->dt2_ = dVar1 * 0.5;
    }
    else {
      builtin_strncpy(painCave.errMsg + 0x20,"t is not set\n",0xe);
      builtin_strncpy(painCave.errMsg + 0x10,"eDamped Error: d",0x10);
      builtin_strncpy(painCave.errMsg,"FluctuatingCharg",0x10);
      painCave.isFatal = 1;
      simError();
    }
    pFVar3 = (this->super_FluctuatingChargePropagator).fqParams_;
    if ((pFVar3->DragCoefficient).super_ParameterBase.empty_ == true) {
      memcpy(&painCave,
             "If you use the FluctuatingChargeDamped\n\tpropagator, you must set flucQ dragCoefficient .\n"
             ,0x5a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      return;
    }
    this->drag_ = (pFVar3->DragCoefficient).data_;
  }
  return;
}

Assistant:

void FluctuatingChargeDamped::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeDamped Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!fqParams_->haveDragCoefficient()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeDamped\n"
                 "\tpropagator, you must set flucQ dragCoefficient .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        drag_ = fqParams_->getDragCoefficient();
      }
    }
  }